

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::Capturer::captureValue(Capturer *this,size_t index,string *value)

{
  pointer pMVar1;
  ulong uVar2;
  
  pMVar1 = (this->m_messages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->m_messages).
                 super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl
                 .super__Vector_impl_data._M_finish - (long)pMVar1 >> 4) * -0x3333333333333333;
  if (index <= uVar2 && uVar2 - index != 0) {
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    _M_append(&pMVar1[index].message,(value->_M_dataplus)._M_p,value->_M_string_length);
    (*this->m_resultCapture->_vptr_IResultCapture[8])
              (this->m_resultCapture,
               (this->m_messages).
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
               super__Vector_impl_data._M_start + index);
    this->m_captured = this->m_captured + 1;
    return;
  }
  __assert_fail("index < m_messages.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/pyxll[P]xlfparser/tests/catch.hpp"
                ,0x24e6,"void Catch::Capturer::captureValue(size_t, const std::string &)");
}

Assistant:

void Capturer::captureValue( size_t index, std::string const& value ) {
        assert( index < m_messages.size() );
        m_messages[index].message += value;
        m_resultCapture.pushScopedMessage( m_messages[index] );
        m_captured++;
    }